

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomHelper.h
# Opt level: O0

vector<Teacher,_std::allocator<Teacher>_> *
GetRandomSubset<Teacher>
          (vector<Teacher,_std::allocator<Teacher>_> *__return_storage_ptr__,
          vector<Teacher,_std::allocator<Teacher>_> *vec,size_t len)

{
  result_type_conflict rVar1;
  allocator<Teacher> local_2769;
  __normal_iterator<Teacher_*,_std::vector<Teacher,_std::allocator<Teacher>_>_> local_2768;
  __normal_iterator<Teacher_*,_std::vector<Teacher,_std::allocator<Teacher>_>_> local_2760;
  __normal_iterator<Teacher_*,_std::vector<Teacher,_std::allocator<Teacher>_>_> local_2758;
  random_device local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  __normal_iterator<Teacher_*,_std::vector<Teacher,_std::allocator<Teacher>_>_> local_30;
  __normal_iterator<Teacher_*,_std::vector<Teacher,_std::allocator<Teacher>_>_> local_28;
  size_t local_20;
  size_t len_local;
  vector<Teacher,_std::allocator<Teacher>_> *vec_local;
  
  local_20 = len;
  len_local = (size_t)vec;
  vec_local = __return_storage_ptr__;
  local_28._M_current = (Teacher *)std::vector<Teacher,_std::allocator<Teacher>_>::begin(vec);
  local_30._M_current = (Teacher *)std::vector<Teacher,_std::allocator<Teacher>_>::end(vec);
  std::random_device::random_device(&local_2740);
  rVar1 = std::random_device::operator()(&local_2740);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(&local_13b8,(ulong)rVar1);
  std::
  shuffle<__gnu_cxx::__normal_iterator<Teacher*,std::vector<Teacher,std::allocator<Teacher>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (local_28,local_30,&local_13b8);
  std::random_device::~random_device(&local_2740);
  local_2758._M_current = (Teacher *)std::vector<Teacher,_std::allocator<Teacher>_>::begin(vec);
  local_2768._M_current = (Teacher *)std::vector<Teacher,_std::allocator<Teacher>_>::begin(vec);
  local_2760 = __gnu_cxx::
               __normal_iterator<Teacher_*,_std::vector<Teacher,_std::allocator<Teacher>_>_>::
               operator+(&local_2768,local_20);
  std::allocator<Teacher>::allocator(&local_2769);
  std::vector<Teacher,std::allocator<Teacher>>::
  vector<__gnu_cxx::__normal_iterator<Teacher*,std::vector<Teacher,std::allocator<Teacher>>>,void>
            ((vector<Teacher,std::allocator<Teacher>> *)__return_storage_ptr__,local_2758,local_2760
             ,&local_2769);
  std::allocator<Teacher>::~allocator(&local_2769);
  return __return_storage_ptr__;
}

Assistant:

static vector<T> GetRandomSubset(vector<T> vec, size_t len) {
    shuffle(vec.begin(), vec.end(), mt19937(random_device()()));
    return {vec.begin(), vec.begin() + len};
}